

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valfmt_get.c
# Opt level: O1

int mpt_valfmt_get(mpt_value_format *ptr,char *src)

{
  char cVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  char *__nptr;
  ushort uVar9;
  uint16_t uVar10;
  ushort uVar11;
  char *pcVar12;
  char *next;
  uint8_t local_4c;
  char *local_38;
  
  if (src == (char *)0x0) {
    ptr->flags = 0;
    ptr->width = '\0';
    ptr->dec = '\0';
    return 0;
  }
  ppuVar3 = __ctype_b_loc();
  puVar2 = *ppuVar3;
  iVar8 = -1;
  pcVar12 = src;
  do {
    __nptr = pcVar12;
    cVar1 = *__nptr;
    iVar8 = iVar8 + 1;
    pcVar12 = __nptr + 1;
  } while ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  if (cVar1 == '\0') {
    ptr->flags = 0;
    ptr->width = '\0';
    ptr->dec = '\0';
    return iVar8;
  }
  if (cVar1 == '+') {
    uVar11 = 0x100;
    uVar9 = 0x100;
    uVar10 = 0x100;
    __nptr = __nptr + 1;
  }
  else {
    uVar11 = 0;
    uVar9 = 0;
    uVar10 = 0;
  }
  pp_Var4 = __ctype_tolower_loc();
  iVar8 = (*pp_Var4)[*__nptr];
  switch(iVar8) {
  case 0x61:
    uVar10 = uVar9 | 0x20;
    break;
  case 0x62:
  case 99:
  case 100:
switchD_001125c8_caseD_62:
    if ((*(byte *)((long)puVar2 + (long)*__nptr * 2 + 1) & 8) == 0) {
      return -1;
    }
    goto LAB_00112622;
  case 0x65:
switchD_001125c8_caseD_65:
    uVar10 = uVar11 | 0x20;
    goto LAB_0011261f;
  case 0x66:
    local_4c = '\x06';
    goto LAB_0011260a;
  case 0x67:
    local_4c = '\0';
LAB_0011260a:
    __nptr = __nptr + 1;
    goto LAB_0011262a;
  default:
    if (iVar8 == 0x6f) {
      uVar11 = uVar10 | 2;
      goto switchD_001125c8_caseD_65;
    }
    if (iVar8 != 0x78) goto switchD_001125c8_caseD_62;
  }
  uVar10 = uVar10 | 0x11;
LAB_0011261f:
  __nptr = __nptr + 1;
LAB_00112622:
  local_4c = '\0';
LAB_0011262a:
  uVar5 = strtol(__nptr,&local_38,0);
  iVar8 = -1;
  if (local_38 != __nptr) {
    if (uVar5 < 0x100) {
      cVar1 = *local_38;
      if (((long)cVar1 == 0) || ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0)) {
        ptr->flags = uVar10;
        ptr->width = (uint8_t)uVar5;
        ptr->dec = local_4c;
        iVar8 = (int)local_38 - (int)src;
      }
      else if (cVar1 == '.') {
        pcVar12 = local_38 + 1;
        uVar6 = strtol(pcVar12,&local_38,0);
        if ((local_38 != pcVar12) && (iVar8 = -2, uVar6 < 0x7f)) {
          ptr->flags = uVar10;
          ptr->width = (uint8_t)uVar5;
          ptr->dec = (uint8_t)uVar6;
          iVar8 = (int)local_38 - (int)src;
        }
      }
      else {
        piVar7 = __errno_location();
        *piVar7 = 0x16;
        iVar8 = -3;
      }
    }
    else {
      iVar8 = -2;
    }
  }
  return iVar8;
}

Assistant:

extern int mpt_valfmt_get(MPT_STRUCT(value_format) *ptr, const char *src)
{
	MPT_STRUCT(value_format) fmt = MPT_VALFMT_INIT;
	const char *pos;
	char *next;
	long val;
	
	if (!(pos = src)) {
		*ptr = fmt;
		return 0;
	}
	while (isspace(*pos)) {
		pos++;
	}
	/* select format */
	if (!*pos) {
		*ptr = fmt;
		return pos - src;
	}
	if (*pos == '+') {
		fmt.flags |= MPT_VALFMT(Sign);
		++pos;
	}
	
	switch (tolower(*pos)) {
	  case 'f': fmt.dec = 6; /* fall through */
	  case 'g': ++pos; break;
	  case 'a': fmt.flags |= MPT_VALFMT(Scientific); /* fall through */
	  case 'x': fmt.flags |= MPT_VALFMT(NumberHex); ++pos; break;
	  case 'o': fmt.flags |= MPT_VALFMT(IntOctal); /* fall through */
	  case 'e': fmt.flags |= MPT_VALFMT(Scientific); ++pos; break;
	  default:
		if (!isdigit(*pos)) {
			return MPT_ERROR(BadArgument);
		}
	}
	/* get field with */
	val = strtol(pos, &next, 0);
	
	if (next == pos) {
		return MPT_ERROR(BadArgument);
	}
	pos = next;
	if (val < 0 || val > UINT8_MAX) {
		return MPT_ERROR(BadValue);
	}
	fmt.width = val;
	if (!*pos || isspace(*pos)) {
		*ptr = fmt;
		return pos - src;
	}
	if (*(pos++) != '.') {
		errno = EINVAL;
		return -3;
	}
	/* get digits after decimal point */
	val = strtol(pos, &next, 0);
	
	if (next == pos) {
		return MPT_ERROR(BadArgument);
	}
	pos = next;
	if (val < 0 || val >= INT8_MAX) {
		return MPT_ERROR(BadValue);
	}
	fmt.dec = val;
	
	*ptr = fmt;
	
	return pos - src;
}